

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

RECEIVED_HANDLE received_create(uint32_t section_number_value,uint64_t section_offset_value)

{
  int iVar1;
  RECEIVED_HANDLE __ptr;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  AMQP_VALUE item_value_00;
  RECEIVED_INSTANCE *received_instance;
  bool bVar2;
  
  __ptr = (RECEIVED_HANDLE)malloc(8);
  if (__ptr != (RECEIVED_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x23);
    __ptr->composite_value = value;
    if (value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_create_uint(section_number_value);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      item_value_00 = amqpvalue_create_ulong(section_offset_value);
      bVar2 = iVar1 == 0;
      if (bVar2) {
        iVar1 = amqpvalue_set_composite_item(value,1,item_value_00);
        bVar2 = iVar1 == 0;
      }
      amqpvalue_destroy(item_value);
      amqpvalue_destroy(item_value_00);
      if (bVar2) {
        return __ptr;
      }
      amqpvalue_destroy(value);
    }
    free(__ptr);
  }
  return (RECEIVED_HANDLE)0x0;
}

Assistant:

RECEIVED_HANDLE received_create(uint32_t section_number_value, uint64_t section_offset_value)
{
    RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)malloc(sizeof(RECEIVED_INSTANCE));
    if (received_instance != NULL)
    {
        received_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(35);
        if (received_instance->composite_value == NULL)
        {
            free(received_instance);
            received_instance = NULL;
        }
        else
        {
            AMQP_VALUE section_number_amqp_value;
            AMQP_VALUE section_offset_amqp_value;
            int result = 0;

            section_number_amqp_value = amqpvalue_create_uint(section_number_value);
            if ((result == 0) && (amqpvalue_set_composite_item(received_instance->composite_value, 0, section_number_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            section_offset_amqp_value = amqpvalue_create_ulong(section_offset_value);
            if ((result == 0) && (amqpvalue_set_composite_item(received_instance->composite_value, 1, section_offset_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(section_number_amqp_value);
            amqpvalue_destroy(section_offset_amqp_value);
            if (result != 0)
            {
                received_destroy(received_instance);
                received_instance = NULL;
            }
        }
    }

    return received_instance;
}